

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Inse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  char *pcVar6;
  char *pcVar7;
  uint fVerbose;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  local_44 = 1000;
  local_48 = 10;
  local_3c = 0;
  fVerbose = 0;
LAB_0028e72b:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"FWTsvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 < 0x54) {
      if (iVar3 == -1) {
        pGVar1 = pAbc->pGia;
        if (pGVar1 == (Gia_Man_t *)0x0) {
          pcVar6 = "Abc_CommandAbc9Inse(): There is no AIG.\n";
        }
        else {
          if (pGVar1->nRegs != 0) {
            if (pGVar1->vInitClasses != (Vec_Int_t *)0x0) {
              Abc_Print(1,"Abc_CommandAbc9Inse(): All-0 initial state is assumed.\n");
              pGVar1 = pAbc->pGia;
              pVVar5 = pGVar1->vInitClasses;
              if (pVVar5 != (Vec_Int_t *)0x0) {
                if (pVVar5->pArray != (int *)0x0) {
                  free(pVVar5->pArray);
                  pGVar1->vInitClasses->pArray = (int *)0x0;
                  pVVar5 = pGVar1->vInitClasses;
                  if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_0028e871;
                }
                free(pVVar5);
                pGVar1->vInitClasses = (Vec_Int_t *)0x0;
              }
            }
LAB_0028e871:
            pVVar5 = Gia_ManInseTest(pAbc->pGia,(Vec_Int_t *)0x0,local_48,local_44,local_40,local_3c
                                     ,fVerbose);
            pAbc->pGia->vInitClasses = pVVar5;
            return 0;
          }
          pcVar6 = "Abc_CommandAbc9Inse(): AIG is combinational.\n";
        }
        Abc_Print(-1,pcVar6);
        return 0;
      }
      if (iVar3 != 0x46) goto LAB_0028e8f4;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0028e8e8;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_48 = uVar4;
    }
    else if (iVar3 == 0x54) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_0028e8e8:
        Abc_Print(-1,pcVar6);
        goto LAB_0028e8f4;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_40 = uVar4;
    }
    else {
      if (iVar3 != 0x57) {
        if (iVar3 != 0x73) goto LAB_0028e8f4;
        local_3c = local_3c ^ 1;
        goto LAB_0028e72b;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0028e8e8;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_44 = uVar4;
    }
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
LAB_0028e8f4:
      Abc_Print(-2,"usage: &inse [-FWT num] [-svh]\n");
      Abc_Print(-2,"\t         experimental procedure\n");
      Abc_Print(-2,"\t-F num : the number of timeframes [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-W num : the number of machine words [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                (ulong)local_40);
      pcVar7 = "yes";
      pcVar6 = "yes";
      if (local_3c == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-s     : toggles using ternary simulation [default = %s]\n",pcVar6);
      if (fVerbose == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Inse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Int_t * Gia_ManInseTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose );
    int c, nFrames = 10, nWords = 1000, nTimeOut = 0, fSim = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWTsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 's':
            fSim ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Inse(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Inse(): AIG is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vInitClasses != NULL )
    {
        Abc_Print( 1, "Abc_CommandAbc9Inse(): All-0 initial state is assumed.\n" );
        Vec_IntFreeP( &pAbc->pGia->vInitClasses );
    }
    pAbc->pGia->vInitClasses = Gia_ManInseTest( pAbc->pGia, NULL, nFrames, nWords, nTimeOut, fSim, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &inse [-FWT num] [-svh]\n" );
    Abc_Print( -2, "\t         experimental procedure\n" );
    Abc_Print( -2, "\t-F num : the number of timeframes [default = %d]\n",                    nFrames );
    Abc_Print( -2, "\t-W num : the number of machine words [default = %d]\n",                 nWords );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n", nTimeOut );
    Abc_Print( -2, "\t-s     : toggles using ternary simulation [default = %s]\n",            fSim?     "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",        fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}